

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

sqlid_t hiberlite::Database::allocId(shared_connection *c,string *table)

{
  int *piVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  int iVar3;
  long *plVar4;
  sqlite3_int64 sVar5;
  runtime_error *prVar6;
  char *pcVar7;
  long *plVar8;
  char *err_msg;
  string query;
  char *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_a8 = (char *)0x0;
  std::operator+(&local_40,"INSERT INTO ",table);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_70 = *plVar8;
    lStack_68 = plVar4[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar8;
    local_80 = (long *)*plVar4;
  }
  local_78 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_50 = *plVar8;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar8;
    local_60 = (long *)*plVar4;
  }
  local_58 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_90 = *plVar8;
    lStack_88 = plVar4[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar8;
    local_a0 = (long *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  iVar3 = sqlite3_exec(c->res->res->con,(char *)local_a0,(sqlite3_callback)0x0,(void *)0x0,&local_a8
                      );
  if (local_a8 == (char *)0x0) {
    psVar2 = c->res;
    if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      psVar2->refCount = psVar2->refCount + 1;
    }
    if (iVar3 == 0) {
      if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &psVar2->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*psVar2->_vptr_shared_cnt_obj_pair[1])(psVar2);
        }
      }
      sVar5 = sqlite3_last_insert_rowid(c->res->res->con);
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      return sVar5;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar7 = sqlite3_errmsg(psVar2->res->con);
    std::runtime_error::runtime_error(prVar6,pcVar7);
    *(undefined ***)prVar6 = &PTR__runtime_error_001d46a8;
    __cxa_throw(prVar6,&database_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,local_a8);
  *(undefined ***)prVar6 = &PTR__runtime_error_001d46a8;
  __cxa_throw(prVar6,&database_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

sqlid_t Database::allocId(shared_connection c, std::string table)
{
	//THREAD critical call
	char* err_msg=NULL;
	std::string query="INSERT INTO "+table+" ("+HIBERLITE_PRIMARY_KEY_COLUMN+") VALUES (NULL);";
	HIBERLITE_HL_DBG_DO( std::cout << "exec: " << query << std::endl; )
	int rc=sqlite3_exec(c->getSQLite3Ptr(),query.c_str(),NULL, NULL, &err_msg );
	if(err_msg)
		throw database_error(err_msg);
	database_error::database_assert(rc, c);

	return sqlite3_last_insert_rowid(c->getSQLite3Ptr());
}